

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

bool __thiscall
iutest::detail::IParamTestSuiteInfo::is_same
          (IParamTestSuiteInfo *this,string *base_name,string *package_name)

{
  __type_conflict _Var1;
  
  _Var1 = std::operator==(&this->m_testsuite_base_name,base_name);
  if (_Var1) {
    _Var1 = std::operator==(&this->m_package_name,package_name);
    return _Var1;
  }
  return false;
}

Assistant:

bool is_same(const ::std::string& base_name, const ::std::string& package_name)
    {
        return m_testsuite_base_name == base_name && m_package_name == package_name;
    }